

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductData.cpp
# Opt level: O2

void __thiscall
OpticsParser::PerforatedGeometry::PerforatedGeometry
          (PerforatedGeometry *this,double spacingX,double spacingY,double dimensionX,
          double dimensionY,string *perforationType)

{
  (this->super_ProductGeometry)._vptr_ProductGeometry =
       (_func_int **)&PTR__PerforatedGeometry_001c9570;
  this->spacingX = spacingX;
  this->spacingY = spacingY;
  this->dimensionX = dimensionX;
  this->dimensionY = dimensionY;
  std::__cxx11::string::string((string *)&this->perforationType,perforationType);
  return;
}

Assistant:

OpticsParser::PerforatedGeometry::PerforatedGeometry(double spacingX,
                                                     double spacingY,
                                                     double dimensionX,
                                                     double dimensionY,
                                                     std::string perforationType) :
    spacingX(spacingX),
    spacingY(spacingY),
    dimensionX(dimensionX),
    dimensionY(dimensionY),
    perforationType(perforationType)
{}